

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::char_event(Application *this,uint codepoint)

{
  ulong *puVar1;
  size_type *psVar2;
  PathTracer *this_00;
  uint uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint __len;
  bool bVar7;
  ulong uVar8;
  Scene *this_01;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  switch_modes(this,codepoint);
  switch(*(undefined4 *)&(this->super_Renderer).field_0xc) {
  case 0:
    switch(codepoint) {
    case 0x43:
    case 99:
      DynamicScene::Scene::collapse_selected_element(this->scene);
      break;
    case 0x44:
    case 100:
      DynamicScene::Scene::downsample_selected_mesh(this->scene);
      break;
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x56:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x76:
      break;
    case 0x46:
    case 0x66:
      DynamicScene::Scene::flip_selected_edge(this->scene);
      break;
    case 0x49:
    case 0x69:
      DynamicScene::Scene::resample_selected_mesh(this->scene);
      break;
    case 0x4c:
    case 0x6c:
      queueLoad(this);
      goto LAB_00194839;
    case 0x4e:
    case 0x6e:
      DynamicScene::Scene::selectNextHalfedge(this->scene);
      break;
    case 0x53:
      this_01 = this->scene;
      bVar7 = false;
      goto LAB_001945e0;
    case 0x54:
      DynamicScene::Scene::triangulateSelection(this->scene);
      break;
    case 0x55:
    case 0x75:
      DynamicScene::Scene::upsample_selected_mesh(this->scene);
      break;
    case 0x57:
    case 0x77:
      queueWrite(this);
      goto LAB_00194839;
    case 0x62:
      this->action = (uint)(this->action != Bevel) * 2;
      break;
    case 0x65:
      cycle_edit_action(this);
      break;
    case 0x68:
      DynamicScene::Scene::selectHalfedge(this->scene);
      break;
    case 0x70:
      DynamicScene::Scene::split_selected_edge(this->scene);
      break;
    case 0x73:
      this_01 = this->scene;
      bVar7 = true;
LAB_001945e0:
      DynamicScene::Scene::subdivideSelection(this_01,bVar7);
      break;
    case 0x74:
      DynamicScene::Scene::selectTwinHalfedge(this->scene);
      break;
    default:
      if (codepoint == 0x20) {
        this->action = Navigate;
      }
    }
    break;
  case 1:
    if ((int)codepoint < 0x57) {
      if (codepoint != 0x2b) {
        if (codepoint == 0x2d) goto switchD_00194355_caseD_5f;
        if (codepoint != 0x3d) break;
      }
      PathTracer::stop(this->pathtracer);
      PathTracer::increase_area_light_sample_count(this->pathtracer);
LAB_001943dd:
      PathTracer::start_raytracing(this->pathtracer);
    }
    else {
      switch(codepoint) {
      case 0x57:
switchD_00194355_caseD_57:
        this_00 = this->pathtracer;
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ScreenShot_","");
        uVar4 = time((time_t *)0x0);
        uVar8 = -uVar4;
        if (0 < (long)uVar4) {
          uVar8 = uVar4;
        }
        __len = 1;
        if (9 < uVar8) {
          uVar6 = uVar8;
          uVar3 = 4;
          do {
            __len = uVar3;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_0019460d;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_0019460d;
            }
            if (uVar6 < 10000) goto LAB_0019460d;
            bVar7 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            uVar3 = __len + 4;
          } while (bVar7);
          __len = __len + 1;
        }
LAB_0019460d:
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_d0,(char)__len - (char)((long)uVar4 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_d0 - ((long)uVar4 >> 0x3f)),__len,uVar8);
        uVar8 = 0xf;
        if (local_70 != local_60) {
          uVar8 = local_60[0];
        }
        if (uVar8 < (ulong)(local_c8 + local_68)) {
          uVar8 = 0xf;
          if (local_d0 != local_c0) {
            uVar8 = local_c0[0];
          }
          if (uVar8 < (ulong)(local_c8 + local_68)) goto LAB_00194687;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_00194687:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0);
        }
        local_b0 = &local_a0;
        puVar1 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar1) {
          local_a0 = *puVar1;
          uStack_98 = *(undefined4 *)(puVar5 + 3);
          uStack_94 = *(undefined4 *)((long)puVar5 + 0x1c);
        }
        else {
          local_a0 = *puVar1;
          local_b0 = (ulong *)*puVar5;
        }
        local_a8 = puVar5[1];
        *puVar5 = puVar1;
        puVar5[1] = 0;
        *(undefined1 *)puVar1 = 0;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".png","");
        uVar8 = 0xf;
        if (local_b0 != &local_a0) {
          uVar8 = local_a0;
        }
        if (uVar8 < (ulong)(local_48 + local_a8)) {
          uVar8 = 0xf;
          if (local_50 != local_40) {
            uVar8 = local_40[0];
          }
          if (uVar8 < (ulong)(local_48 + local_a8)) goto LAB_0019475e;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_b0);
        }
        else {
LAB_0019475e:
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar2 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_90.field_2._M_allocated_capacity = *psVar2;
          local_90.field_2._8_8_ = puVar5[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar2;
          local_90._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_90._M_string_length = puVar5[1];
        *puVar5 = psVar2;
        puVar5[1] = 0;
        *(undefined1 *)psVar2 = 0;
        PathTracer::save_image(this_00,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        break;
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5c:
      case 0x5e:
        break;
      case 0x5b:
      case 0x5d:
        goto switchD_00194355_caseD_5b;
      case 0x5f:
switchD_00194355_caseD_5f:
        PathTracer::stop(this->pathtracer);
        PathTracer::decrease_area_light_sample_count(this->pathtracer);
        goto LAB_001943dd;
      default:
        if (codepoint == 0x77) goto switchD_00194355_caseD_57;
      }
    }
    break;
  case 2:
    if ((int)codepoint < 99) {
      switch(codepoint) {
      case 0x50:
switchD_0019430b_caseD_50:
        this->action = Pose;
        setGhosted(this,true);
        break;
      case 0x51:
      case 0x52:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
        break;
      case 0x53:
        this->symmetryEnabled = (bool)(this->symmetryEnabled ^ 1);
        break;
      case 0x58:
        this->symmetryAxis = X;
        break;
      case 0x59:
        this->symmetryAxis = Y;
        break;
      case 0x5a:
        this->symmetryAxis = Z;
        break;
      default:
        if (codepoint == 0x43) {
LAB_001944cb:
          this->clickedJoint = (Joint *)0x0;
          toggle_create_joint_action(this);
        }
      }
    }
    else if ((int)codepoint < 0x67) {
      if (codepoint == 99) goto LAB_001944cb;
      if ((codepoint == 0x65) && (this->action == Object)) {
        DynamicScene::XFormWidget::cycleMode(this->scene->elementTransform);
      }
    }
    else if (codepoint == 0x67) {
      toggleGhosted(this);
    }
    else if (codepoint == 0x70) goto switchD_0019430b_caseD_50;
    break;
  case 3:
    if (codepoint == 0x20) {
      Camera::copy_placement(&this->camera,&this->canonicalCamera);
    }
    else {
switchD_00194355_caseD_5b:
      PathTracer::key_press(this->pathtracer,codepoint);
    }
  }
  executeFileOp(this,codepoint);
LAB_00194839:
  updateWidgets(this);
  return;
}

Assistant:

void Application::char_event(unsigned int codepoint) {
  bool queued = false;

  switch_modes(codepoint);

  switch (mode) {
    case RENDER_MODE:
      switch (codepoint) {
        case 'w':
        case 'W':
          pathtracer->save_image(string("ScreenShot_") +
                                 string(to_string(time(NULL))) +
                                 string(".png"));
          break;
        case '+':
        case '=':
          pathtracer->stop();
          pathtracer->increase_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '-':
        case '_':
          pathtracer->stop();
          pathtracer->decrease_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '[':
        case ']':
          pathtracer->key_press(codepoint);
          break;
      }
      break;
    case VISUALIZE_MODE:
      switch (codepoint) {
        case ' ':
          reset_camera();
          break;
        default:
          pathtracer->key_press(codepoint);
      }
      break;
    case ANIMATE_MODE:
      switch (codepoint) {
        case 'c':
        case 'C':
          // 'c'reate joints
          clickedJoint = nullptr;
          toggle_create_joint_action();
          break;
        case 'e':
          if (action == Action::Object) scene->elementTransform->cycleMode();
          break;
        case 'g':
          toggleGhosted();
          break;
        case 'p':
        case 'P':
          to_pose_action();
          break;
        case 'S':
          symmetryEnabled = !symmetryEnabled;
          break;
        case 'X':
          symmetryAxis = Axis::X;
          break;
        case 'Y':
          symmetryAxis = Axis::Y;
          break;
        case 'Z':
          symmetryAxis = Axis::Z;
          break;
      }
      break;
    case MODEL_MODE:
      switch (codepoint) {
        case 'u':
        case 'U':
          scene->upsample_selected_mesh();
          break;
        case 'd':
        case 'D':
          scene->downsample_selected_mesh();
          break;
        case 'i':
        case 'I':
          // i for isotropic.
          scene->resample_selected_mesh();
          break;
        case 'f':
        case 'F':
          scene->flip_selected_edge();
          break;
        case 'p':
          scene->split_selected_edge();
          break;
        case 'c':
        case 'C':
          scene->collapse_selected_element();
          break;
        case 'n':
        case 'N':
          scene->selectNextHalfedge();
          break;
        case 't':
          scene->selectTwinHalfedge();
          break;
        case 'T':
          scene->triangulateSelection();
          break;
        case 's':
          // Catmull-Clark subdivision
          scene->subdivideSelection(true);
          break;
        case 'S':
          // linear subdivision
          scene->subdivideSelection(false);
          break;
        case 'h':
          scene->selectHalfedge();
          break;
        case ' ':
          to_navigate_action();
          break;
        case 'b':
          toggle_bevel_action();
          break;
        case 'e':
          cycle_edit_action();
          break;
        case 'w':
        case 'W':
          queueWrite();
          queued = true;
          break;
        case 'l':
        case 'L':
          queueLoad();
          queued = true;
          break;
        default:
          break;
      }
      break;
  }

  if (!queued) {
    executeFileOp(codepoint);
  }
  updateWidgets();
}